

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TIntermediate::promoteConstantUnion
          (TIntermediate *this,TBasicType promoteTo,TIntermConstantUnion *node)

{
  double dVar1;
  TStorageQualifier TVar2;
  int iVar3;
  uint size;
  int iVar4;
  undefined4 uVar5;
  int mr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pTVar6;
  long *plVar7;
  long lVar8;
  undefined4 extraout_var_02;
  TBasicType TVar9;
  pointer pTVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar14;
  ulong uVar15;
  bool bVar16;
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar17;
  TConstUnionArray leftUnionArray;
  TConstUnionArray local_d8;
  TType local_c8;
  undefined4 extraout_var_01;
  
  iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  size = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar3));
  TConstUnionArray::TConstUnionArray(&local_d8,size);
  if ((int)size < 1) {
LAB_004131cb:
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    plVar7 = (long *)CONCAT44(extraout_var_01,iVar3);
    lVar8 = (**(code **)(*plVar7 + 0x58))(plVar7);
    TVar2 = *(TStorageQualifier *)(lVar8 + 8);
    iVar3 = (**(code **)(*plVar7 + 0x60))(plVar7);
    iVar4 = (**(code **)(*plVar7 + 0x68))(plVar7);
    mr = (**(code **)(*plVar7 + 0x70))(plVar7);
    TType::TType(&local_c8,promoteTo,TVar2 & 0x7f,iVar3,iVar4,mr,false);
    iVar3 = (**(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)();
    node = addConstantUnion((TIntermediate *)node,&local_d8,&local_c8,
                            (TSourceLoc *)CONCAT44(extraout_var_02,iVar3),false);
switchD_00412720_default:
    return &node->super_TIntermTyped;
  }
  uVar15 = 0;
  iVar3 = promoteTo - EbtFloat;
LAB_004126f8:
  iVar4 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x38))
                    ((long *)CONCAT44(extraout_var_00,iVar4));
  switch(uVar5) {
  case 1:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      goto switchD_0041281e_caseD_0;
    case 3:
switchD_0041281e_caseD_3:
      pTVar6 = ((local_d8.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar6[uVar15].field_0.i8Const =
           (char)(int)(((node->constArray).unionArray)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
LAB_00412bdf:
      pTVar6 = pTVar6 + uVar15;
      TVar9 = EbtInt8;
      break;
    case 4:
switchD_0041281e_caseD_4:
      pTVar6 = ((local_d8.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar6[uVar15].field_0.i8Const =
           (char)(int)(((node->constArray).unionArray)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
LAB_00412b80:
      pTVar6 = pTVar6 + uVar15;
      TVar9 = EbtUint8;
      break;
    case 5:
switchD_0041281e_caseD_5:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.i16Const =
           (short)(int)(((node->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
LAB_0041300d:
      TVar9 = EbtInt16;
      break;
    case 6:
switchD_0041281e_caseD_6:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.i16Const =
           (short)(int)(((node->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
LAB_00413066:
      TVar9 = EbtUint16;
      break;
    case 7:
switchD_0041281e_caseD_7:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.iConst =
           (int)(((node->constArray).unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
LAB_0041318a:
      TVar9 = EbtInt;
      break;
    case 8:
switchD_0041281e_caseD_8:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.iConst =
           (int)(long)(((node->constArray).unionArray)->
                      super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ).
                      super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
LAB_00413138:
      TVar9 = EbtUint;
      break;
    case 9:
switchD_0041281e_caseD_9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.i64Const =
           (long)(((node->constArray).unionArray)->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                 .
                 super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
LAB_004131b7:
      TVar9 = EbtInt64;
      break;
    case 10:
switchD_0041281e_caseD_a:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      dVar1 = (((node->constArray).unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst;
      uVar13 = (ulong)dVar1;
      pTVar10[uVar15].field_0.u64Const =
           (long)(dVar1 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13;
LAB_00413108:
      TVar9 = EbtUint64;
      break;
    case 0xb:
switchD_0041281e_caseD_b:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.bConst =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.dConst != 0.0;
      goto LAB_00412e73;
    default:
      goto switchD_00412720_default;
    }
    goto LAB_004131bc;
  case 2:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      goto switchD_0041281e_caseD_0;
    case 3:
      goto switchD_0041281e_caseD_3;
    case 4:
      goto switchD_0041281e_caseD_4;
    case 5:
      goto switchD_0041281e_caseD_5;
    case 6:
      goto switchD_0041281e_caseD_6;
    case 7:
      goto switchD_0041281e_caseD_7;
    case 8:
      goto switchD_0041281e_caseD_8;
    case 9:
      goto switchD_0041281e_caseD_9;
    case 10:
      goto switchD_0041281e_caseD_a;
    case 0xb:
      goto switchD_0041281e_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
  case 3:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
switchD_0041281e_caseD_0:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = uVar15 * 0x10;
      pTVar6 = pTVar10 + uVar15;
      aVar17 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0;
      break;
    case 3:
      goto switchD_0041281e_caseD_3;
    case 4:
      goto switchD_0041281e_caseD_4;
    case 5:
      goto switchD_0041281e_caseD_5;
    case 6:
      goto switchD_0041281e_caseD_6;
    case 7:
      goto switchD_0041281e_caseD_7;
    case 8:
      goto switchD_0041281e_caseD_8;
    case 9:
      goto switchD_0041281e_caseD_9;
    case 10:
      goto switchD_0041281e_caseD_a;
    case 0xb:
      goto switchD_0041281e_caseD_b;
    default:
      goto switchD_00412720_default;
    }
    break;
  case 4:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
switchD_00412752_caseD_0:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
      goto LAB_00412962;
    case 3:
switchD_00412752_caseD_3:
      pTVar6 = ((local_d8.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar6[uVar15].field_0.i8Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
      goto LAB_00412bdf;
    case 4:
switchD_00412752_caseD_4:
      pTVar6 = ((local_d8.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar6[uVar15].field_0.i8Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
      goto LAB_00412b80;
    case 5:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (ushort)(((node->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
LAB_00413009:
      pTVar6 = pTVar10 + uVar15;
      *(ushort *)&pTVar10[uVar15].field_0 = uVar11;
      goto LAB_0041300d;
    case 6:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (ushort)(((node->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
LAB_00413062:
      pTVar6 = pTVar10 + uVar15;
      *(ushort *)&pTVar10[uVar15].field_0 = uVar11;
      goto LAB_00413066;
    case 7:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
LAB_00413187:
      *(uint *)&pTVar10[uVar15].field_0 = uVar12;
      goto LAB_0041318a;
    case 8:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
LAB_00413135:
      *(uint *)&pTVar10[uVar15].field_0 = uVar12;
      goto LAB_00413138;
    case 9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar14 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
LAB_004131b3:
      pTVar10[uVar15].field_0 = aVar14;
      goto LAB_004131b7;
    case 10:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
LAB_00413104:
      pTVar10[uVar15].field_0 = aVar17;
      goto LAB_00413108;
    case 0xb:
switchD_00412797_caseD_b:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      bVar16 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const == '\0';
LAB_00412e6f:
      pTVar10[uVar15].field_0.bConst = !bVar16;
      break;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_00412e73;
  case 5:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u8Const;
      break;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
switchD_00412752_caseD_5:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (ushort)(((node->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u8Const;
      goto LAB_00413009;
    case 6:
switchD_00412752_caseD_6:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (ushort)(((node->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u8Const;
      goto LAB_00413062;
    case 7:
switchD_00412752_caseD_7:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u8Const;
      goto LAB_00413187;
    case 8:
switchD_00412752_caseD_8:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u8Const;
      goto LAB_00413135;
    case 9:
switchD_00412752_caseD_9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar14.i64Const._1_7_ = 0;
      aVar14.i8Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u8Const;
      goto LAB_004131b3;
    case 10:
switchD_00412752_caseD_a:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17.i64Const._1_7_ = 0;
      aVar17.i8Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u8Const;
      goto LAB_00413104;
    case 0xb:
      goto switchD_00412797_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_00412962;
  case 6:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const;
      break;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
switchD_0041298f_caseD_5:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.i16Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const;
      goto LAB_0041300d;
    case 6:
switchD_0041298f_caseD_6:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.i16Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const;
      goto LAB_00413066;
    case 7:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const;
      goto LAB_00413187;
    case 8:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const;
      goto LAB_00413135;
    case 9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar14 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const;
      goto LAB_004131b3;
    case 10:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const;
      goto LAB_00413104;
    case 0xb:
switchD_0041293d_caseD_b:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      bVar16 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i16Const == 0;
      goto LAB_00412e6f;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_00412962;
  case 7:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u16Const;
LAB_00412962:
      lVar8 = uVar15 << 4;
      aVar17 = (uint)(double)uVar12;
      break;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
      goto switchD_0041298f_caseD_5;
    case 6:
      goto switchD_0041298f_caseD_6;
    case 7:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u16Const;
      goto LAB_00413187;
    case 8:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (uint)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u16Const;
      goto LAB_00413135;
    case 9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar14.i64Const._2_6_ = 0;
      aVar14.i16Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u16Const;
      goto LAB_004131b3;
    case 10:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17.i64Const._2_6_ = 0;
      aVar17.i16Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.u16Const;
      goto LAB_00413104;
    case 0xb:
      goto switchD_0041293d_caseD_b;
    default:
      goto switchD_00412720_default;
    }
    break;
  case 8:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = uVar15 * 0x10;
      pTVar6 = pTVar10 + uVar15;
      aVar17.dConst =
           (double)(((node->constArray).unionArray)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.iConst;
      break;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
      goto switchD_0041298f_caseD_5;
    case 6:
      goto switchD_0041298f_caseD_6;
    case 7:
switchD_0041298f_caseD_7:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.iConst;
      goto LAB_00413187;
    case 8:
switchD_0041298f_caseD_8:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      uVar12 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.iConst;
      goto LAB_00413135;
    case 9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar14 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.iConst;
      goto LAB_004131b3;
    case 10:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17 = (anon_union_8_11_a9b10978_for_TConstUnion_0)
               (long)(((node->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.iConst;
      goto LAB_00413104;
    case 0xb:
switchD_004129ee_caseD_b:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      bVar16 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.iConst == 0;
      goto LAB_00412e6f;
    default:
      goto switchD_00412720_default;
    }
    break;
  case 9:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = uVar15 * 0x10;
      pTVar6 = pTVar10 + uVar15;
      aVar17.dConst =
           (double)(((node->constArray).unionArray)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.uConst;
      break;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
      goto switchD_0041298f_caseD_5;
    case 6:
      goto switchD_0041298f_caseD_6;
    case 7:
      goto switchD_0041298f_caseD_7;
    case 8:
      goto switchD_0041298f_caseD_8;
    case 9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar14.i64Const._4_4_ = 0;
      aVar14.iConst =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.uConst;
      goto LAB_004131b3;
    case 10:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17.i64Const._4_4_ = 0;
      aVar17.iConst =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.uConst;
      goto LAB_00413104;
    case 0xb:
      goto switchD_004129ee_caseD_b;
    default:
      goto switchD_00412720_default;
    }
    break;
  case 10:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = uVar15 * 0x10;
      pTVar6 = pTVar10 + uVar15;
      aVar17.dConst =
           (double)(((node->constArray).unionArray)->
                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ).
                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i64Const;
      break;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
      goto switchD_0041298f_caseD_5;
    case 6:
      goto switchD_0041298f_caseD_6;
    case 7:
      goto switchD_0041298f_caseD_7;
    case 8:
      goto switchD_0041298f_caseD_8;
    case 9:
switchD_0041298f_caseD_9:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar14 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0;
      goto LAB_004131b3;
    case 10:
switchD_0041298f_caseD_a:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0;
      goto LAB_00413104;
    case 0xb:
switchD_0041298f_caseD_b:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      bVar16 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i64Const == 0;
      goto LAB_00412e6f;
    default:
      goto switchD_00412720_default;
    }
    break;
  case 0xb:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      aVar17 = (((node->constArray).unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15].field_0;
      pTVar10[uVar15].field_0.dConst =
           ((double)CONCAT44(0x45300000,(int)((ulong)aVar17 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,aVar17.iConst) - 4503599627370496.0);
      break;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
      goto switchD_0041298f_caseD_5;
    case 6:
      goto switchD_0041298f_caseD_6;
    case 7:
      goto switchD_0041298f_caseD_7;
    case 8:
      goto switchD_0041298f_caseD_8;
    case 9:
      goto switchD_0041298f_caseD_9;
    case 10:
      goto switchD_0041298f_caseD_a;
    case 0xb:
      goto switchD_0041298f_caseD_b;
    default:
      return &node->super_TIntermTyped;
    }
    goto LAB_0041296e;
  case 0xc:
    switch(iVar3) {
    case 0:
    case 1:
    case 2:
      goto switchD_00412752_caseD_0;
    case 3:
      goto switchD_00412752_caseD_3;
    case 4:
      goto switchD_00412752_caseD_4;
    case 5:
      goto switchD_00412752_caseD_5;
    case 6:
      goto switchD_00412752_caseD_6;
    case 7:
      goto switchD_00412752_caseD_7;
    case 8:
      goto switchD_00412752_caseD_8;
    case 9:
      goto switchD_00412752_caseD_9;
    case 10:
      goto switchD_00412752_caseD_a;
    case 0xb:
      pTVar10 = ((local_d8.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = pTVar10 + uVar15;
      pTVar10[uVar15].field_0.i8Const =
           (((node->constArray).unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15].field_0.i8Const;
LAB_00412e73:
      TVar9 = EbtBool;
      goto LAB_004131bc;
    }
  default:
    goto switchD_00412720_default;
  }
  ((anon_union_8_11_a9b10978_for_TConstUnion_0 *)((long)&pTVar10->field_0 + lVar8))->dConst =
       (double)aVar17;
LAB_0041296e:
  TVar9 = EbtDouble;
LAB_004131bc:
  pTVar6->type = TVar9;
  uVar15 = uVar15 + 1;
  if (uVar15 == size) goto LAB_004131cb;
  goto LAB_004126f8;
}

Assistant:

TIntermTyped* TIntermediate::promoteConstantUnion(TBasicType promoteTo, TIntermConstantUnion* node) const
{
    const TConstUnionArray& rightUnionArray = node->getConstArray();
    int size = node->getType().computeNumComponents();

    TConstUnionArray leftUnionArray(size);

    for (int i=0; i < size; i++) {

#define PROMOTE(Set, CType, Get) leftUnionArray[i].Set(static_cast<CType>(rightUnionArray[i].Get()))
#define PROMOTE_TO_BOOL(Get) leftUnionArray[i].setBConst(rightUnionArray[i].Get() != 0)

#define TO_ALL(Get)   \
        switch (promoteTo) { \
        case EbtFloat16: PROMOTE(setDConst, double, Get); break; \
        case EbtFloat: PROMOTE(setDConst, double, Get); break; \
        case EbtDouble: PROMOTE(setDConst, double, Get); break; \
        case EbtInt8: PROMOTE(setI8Const, signed char, Get); break; \
        case EbtInt16: PROMOTE(setI16Const, short, Get); break; \
        case EbtInt: PROMOTE(setIConst, int, Get); break; \
        case EbtInt64: PROMOTE(setI64Const, long long, Get); break; \
        case EbtUint8: PROMOTE(setU8Const, unsigned char, Get); break; \
        case EbtUint16: PROMOTE(setU16Const, unsigned short, Get); break; \
        case EbtUint: PROMOTE(setUConst, unsigned int, Get); break; \
        case EbtUint64: PROMOTE(setU64Const, unsigned long long, Get); break; \
        case EbtBool: PROMOTE_TO_BOOL(Get); break; \
        default: return node; \
        }

        switch (node->getType().getBasicType()) {
        case EbtFloat: TO_ALL(getDConst); break;
        case EbtInt: TO_ALL(getIConst); break;
        case EbtUint: TO_ALL(getUConst); break;
        case EbtBool: TO_ALL(getBConst); break;
        case EbtFloat16: TO_ALL(getDConst); break;
        case EbtDouble: TO_ALL(getDConst); break;
        case EbtInt8: TO_ALL(getI8Const); break;
        case EbtInt16: TO_ALL(getI16Const); break;
        case EbtInt64: TO_ALL(getI64Const); break;
        case EbtUint8: TO_ALL(getU8Const); break;
        case EbtUint16: TO_ALL(getU16Const); break;
        case EbtUint64: TO_ALL(getU64Const); break;
        default: return node;
        }
    }

    const TType& t = node->getType();

    return addConstantUnion(leftUnionArray, TType(promoteTo, t.getQualifier().storage, t.getVectorSize(), t.getMatrixCols(), t.getMatrixRows()),
                            node->getLoc());
}